

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

void hd_map_remove(nghttp2_hd_map *map,nghttp2_hd_entry *ent)

{
  nghttp2_hd_entry *pnVar1;
  nghttp2_hd_entry **ppnVar2;
  nghttp2_hd_entry **ppnVar3;
  
  ppnVar2 = map->table + (ent->hash & 0x7f);
  do {
    ppnVar3 = ppnVar2;
    pnVar1 = *ppnVar3;
    if (pnVar1 == (nghttp2_hd_entry *)0x0) {
      return;
    }
    ppnVar2 = &pnVar1->next;
  } while (pnVar1 != ent);
  *ppnVar3 = ent->next;
  ent->next = (nghttp2_hd_entry *)0x0;
  return;
}

Assistant:

static void hd_map_remove(nghttp2_hd_map *map, nghttp2_hd_entry *ent) {
  nghttp2_hd_entry **dst;

  dst = &map->table[ent->hash & (HD_MAP_SIZE - 1)];

  for (; *dst; dst = &(*dst)->next) {
    if (*dst != ent) {
      continue;
    }

    *dst = ent->next;
    ent->next = NULL;
    return;
  }
}